

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_session.c
# Opt level: O3

int nghttp2_session_add_rst_stream(nghttp2_session *session,int32_t stream_id,uint32_t error_code)

{
  uint8_t uVar1;
  int iVar2;
  void *pvVar3;
  nghttp2_outbound_item *pnVar4;
  
  pvVar3 = nghttp2_map_find(&session->streams,stream_id);
  if (((pvVar3 != (void *)0x0) && ((*(byte *)((long)pvVar3 + 0xd8) & 2) == 0)) &&
     (*(int *)((long)pvVar3 + 0xcc) == 3)) {
    return 0;
  }
  if ((stream_id == 0) || (uVar1 = session->server, ((uVar1 == '\0' ^ (byte)stream_id) & 1) != 0)) {
    if (session->last_recv_stream_id < stream_id) {
      return 0;
    }
    if (stream_id == 0) goto LAB_00521bdb;
    uVar1 = session->server;
  }
  else if (session->next_stream_id <= (uint)stream_id) {
    return 0;
  }
  if (((uVar1 == '\0') && ((stream_id & 1U) != 0)) &&
     (pnVar4 = (session->ob_syn).head, pnVar4 != (nghttp2_outbound_item *)0x0)) {
    if ((pnVar4->frame).hd.type != '\x01') {
      __assert_fail("headers_frame->hd.type == NGHTTP2_HEADERS",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Utilities/cmnghttp2/lib/nghttp2_session.c"
                    ,0x4de,
                    "int nghttp2_session_add_rst_stream(nghttp2_session *, int32_t, uint32_t)");
    }
    if ((pnVar4->frame).hd.stream_id <= stream_id) {
      do {
        iVar2 = (pnVar4->frame).hd.stream_id;
        if (stream_id <= iVar2) {
          if ((iVar2 <= stream_id) && ((pnVar4->aux_data).headers.canceled == '\0')) {
            (pnVar4->aux_data).headers.error_code = error_code;
            (pnVar4->aux_data).headers.canceled = '\x01';
            return 0;
          }
          break;
        }
        pnVar4 = pnVar4->qnext;
      } while (pnVar4 != (nghttp2_outbound_item *)0x0);
    }
  }
LAB_00521bdb:
  pnVar4 = (nghttp2_outbound_item *)nghttp2_mem_malloc(&session->mem,0x98);
  if (pnVar4 == (nghttp2_outbound_item *)0x0) {
    return -0x385;
  }
  nghttp2_outbound_item_init(pnVar4);
  nghttp2_frame_rst_stream_init((nghttp2_rst_stream *)pnVar4,stream_id,error_code);
  iVar2 = nghttp2_session_add_item(session,pnVar4);
  if (iVar2 == 0) {
    return 0;
  }
  nghttp2_frame_rst_stream_free((nghttp2_rst_stream *)pnVar4);
  nghttp2_mem_free(&session->mem,pnVar4);
  return iVar2;
}

Assistant:

int nghttp2_session_add_rst_stream(nghttp2_session *session, int32_t stream_id,
                                   uint32_t error_code) {
  int rv;
  nghttp2_outbound_item *item;
  nghttp2_frame *frame;
  nghttp2_stream *stream;
  nghttp2_mem *mem;

  mem = &session->mem;
  stream = nghttp2_session_get_stream(session, stream_id);
  if (stream && stream->state == NGHTTP2_STREAM_CLOSING) {
    return 0;
  }

  /* Sending RST_STREAM to an idle stream is subject to protocol
     violation.  Historically, nghttp2 allows this.  In order not to
     disrupt the existing applications, we don't error out this case
     and simply ignore it. */
  if (nghttp2_session_is_my_stream_id(session, stream_id)) {
    if ((uint32_t)stream_id >= session->next_stream_id) {
      return 0;
    }
  } else if (session->last_recv_stream_id < stream_id) {
    return 0;
  }

  /* Cancel pending request HEADERS in ob_syn if this RST_STREAM
     refers to that stream. */
  if (!session->server && nghttp2_session_is_my_stream_id(session, stream_id) &&
      nghttp2_outbound_queue_top(&session->ob_syn)) {
    nghttp2_headers_aux_data *aux_data;
    nghttp2_frame *headers_frame;

    headers_frame = &nghttp2_outbound_queue_top(&session->ob_syn)->frame;
    assert(headers_frame->hd.type == NGHTTP2_HEADERS);

    if (headers_frame->hd.stream_id <= stream_id) {

      for (item = session->ob_syn.head; item; item = item->qnext) {
        aux_data = &item->aux_data.headers;

        if (item->frame.hd.stream_id < stream_id) {
          continue;
        }

        /* stream_id in ob_syn queue must be strictly increasing.  If
           we found larger ID, then we can break here. */
        if (item->frame.hd.stream_id > stream_id || aux_data->canceled) {
          break;
        }

        aux_data->error_code = error_code;
        aux_data->canceled = 1;

        return 0;
      }
    }
  }

  item = nghttp2_mem_malloc(mem, sizeof(nghttp2_outbound_item));
  if (item == NULL) {
    return NGHTTP2_ERR_NOMEM;
  }

  nghttp2_outbound_item_init(item);

  frame = &item->frame;

  nghttp2_frame_rst_stream_init(&frame->rst_stream, stream_id, error_code);
  rv = nghttp2_session_add_item(session, item);
  if (rv != 0) {
    nghttp2_frame_rst_stream_free(&frame->rst_stream);
    nghttp2_mem_free(mem, item);
    return rv;
  }
  return 0;
}